

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O3

void print<ft::stack<double,ft::deque<double,ft::allocator<double>>>>
               (stack<double,_ft::deque<double,_ft::allocator<double>_>_> *t,char *s)

{
  size_type *psVar1;
  map_pointer ppvVar2;
  long lVar3;
  undefined8 in_RAX;
  size_t sVar4;
  pointer pvVar5;
  undefined8 uStack_38;
  
  lVar3 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar3 + -0x18) + 0x1100b0);
  }
  else {
    sVar4 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  if ((t->c).m_size != 0) {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      pvVar5 = (t->c).m_finish.m_cur;
      if (pvVar5 == (t->c).m_finish.m_first) {
        pvVar5 = (t->c).m_finish.m_node[-1] + 0x20;
      }
      std::ostream::_M_insert<double>(pvVar5[-1]);
      pvVar5 = (t->c).m_finish.m_cur;
      if (pvVar5 == (t->c).m_finish.m_first) {
        ppvVar2 = (t->c).m_finish.m_node;
        (t->c).m_finish.m_node = ppvVar2 + -1;
        pvVar5 = ppvVar2[-1];
        (t->c).m_finish.m_first = pvVar5;
        pvVar5 = pvVar5 + 0x20;
        (t->c).m_finish.m_last = pvVar5;
      }
      (t->c).m_finish.m_cur = pvVar5 + -1;
      psVar1 = &(t->c).m_size;
      *psVar1 = *psVar1 - 1;
    } while (*psVar1 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.top();
		t.pop();
	}
	std::cout << std::endl;
}